

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall Json::StreamWriterBuilder::validate(StreamWriterBuilder *this,Value *invalid)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  Value *other;
  Value *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  byte bVar5;
  long *plVar6;
  long lVar7;
  Value *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_iterator cVar8;
  String key;
  allocator_type local_141;
  ValueIteratorBase local_140;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if ((validate(Json::Value*)::valid_keys_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&validate(Json::Value*)::valid_keys_abi_cxx11_), iVar2 != 0)) {
    psVar4 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)operator_new(0x30);
    local_130._0_8_ = &local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"indentation","");
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"commentStyle","");
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"enableYAMLCompatibility","")
    ;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"dropNullPlaceholders","");
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"useSpecialFloats","");
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"emitUTF8","");
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"precision","");
    plVar6 = local_40;
    local_50[0] = plVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"precisionType","");
    __l._M_len = 8;
    __l._M_array = (iterator)local_130;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(psVar4,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_140,&local_141);
    lVar7 = -0x100;
    do {
      if (plVar6 != (long *)plVar6[-2]) {
        operator_delete((long *)plVar6[-2],*plVar6 + 1);
      }
      plVar6 = plVar6 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    validate(Json::Value*)::valid_keys_abi_cxx11_ = psVar4;
    __cxa_guard_release(&validate(Json::Value*)::valid_keys_abi_cxx11_);
  }
  this_01 = &this->settings_;
  cVar8 = Value::begin(this_01);
  local_140.current_ = cVar8.super_ValueIteratorBase.current_._M_node;
  local_140.isNull_ = cVar8.super_ValueIteratorBase.isNull_;
  cVar8 = Value::end(this_01);
  local_130._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
  local_130[8] = cVar8.super_ValueIteratorBase.isNull_;
  bVar1 = ValueIteratorBase::isEqual(&local_140,(SelfType *)local_130);
  if (!bVar1) {
    do {
      ValueIteratorBase::name_abi_cxx11_((String *)local_130,&local_140);
      psVar4 = validate(Json::Value*)::valid_keys_abi_cxx11_;
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&validate(Json::Value*)::valid_keys_abi_cxx11_->_M_t,(String *)local_130);
      bVar1 = (_Rb_tree_header *)cVar3._M_node != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
      if (invalid == (Value *)0x0 || bVar1) {
        bVar5 = bVar1 * '\x03' + 1;
      }
      else {
        other = ValueIteratorBase::deref(&local_140);
        this_00 = Value::operator[](invalid,(String *)local_130);
        bVar5 = 0;
        Value::operator=(this_00,other);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._0_8_ != &local_120) {
        operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
      }
      if ((bVar5 & 3) != 0) {
        return false;
      }
      ValueIteratorBase::increment(&local_140);
      cVar8 = Value::end(this_01);
      local_130._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
      local_130[8] = cVar8.super_ValueIteratorBase.isNull_;
      bVar1 = ValueIteratorBase::isEqual(&local_140,(SelfType *)local_130);
    } while (!bVar1);
  }
  if (invalid == (Value *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = Value::empty(invalid);
  }
  return bVar1;
}

Assistant:

bool StreamWriterBuilder::validate(Json::Value* invalid) const {
  static const auto& valid_keys = *new std::set<String>{
      "indentation",
      "commentStyle",
      "enableYAMLCompatibility",
      "dropNullPlaceholders",
      "useSpecialFloats",
      "emitUTF8",
      "precision",
      "precisionType",
  };
  for (auto si = settings_.begin(); si != settings_.end(); ++si) {
    auto key = si.name();
    if (valid_keys.count(key))
      continue;
    if (invalid)
      (*invalid)[key] = *si;
    else
      return false;
  }
  return invalid ? invalid->empty() : true;
}